

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall
moira::Moira::computeEAbrief<(moira::Core)2,(moira::Mode)10,1,128ull>(Moira *this,u32 an)

{
  ushort uVar1;
  u32 uVar2;
  u32 local_34;
  u32 xn;
  u16 disp;
  u16 scale;
  u16 lw;
  u16 rn;
  u16 ext;
  u32 result;
  u32 an_local;
  Moira *this_local;
  
  uVar1 = (this->queue).irc;
  if (((int)(uint)uVar1 >> 0xb & 1U) == 0) {
    uVar2 = readR<4>(this,(int)(uint)uVar1 >> 0xc);
    local_34 = SEXT<2>((ulong)uVar2);
  }
  else {
    local_34 = readR<4>(this,(int)(uint)uVar1 >> 0xc);
  }
  readExt<(moira::Core)2>(this);
  return an + (int)(char)uVar1 + (local_34 << ((byte)((int)(uint)uVar1 >> 9) & 3));
}

Assistant:

u32
Moira::computeEAbrief(u32 an)
{
    u32 result;

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 ext   = queue.irc;
    u16 rn    = xxxx____________ (ext);
    u16 lw    = ____x___________ (ext);
    u16 scale = _____xx_________ (ext);
    u16 disp  = ________xxxxxxxx (ext);

    u32 xn = u32(u64(lw ? readR(rn) : SEXT<Word>(readR(rn))) << scale);
    result = U32_ADD3(an, i8(disp), xn);

    SYNC(2);
    if ((F & SKIP_LAST_RD) == 0) { readExt<C>(); } else { reg.pc += 2; }

    return result;
}